

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlNewTextReaderFilename(char *URI)

{
  xmlParserInputBufferPtr input_00;
  xmlChar *pxVar1;
  xmlChar *local_30;
  char *directory;
  xmlTextReaderPtr ret;
  xmlParserInputBufferPtr input;
  char *URI_local;
  
  local_30 = (xmlChar *)0x0;
  input_00 = xmlParserInputBufferCreateFilename(URI,XML_CHAR_ENCODING_NONE);
  if (input_00 == (xmlParserInputBufferPtr)0x0) {
    URI_local = (char *)0x0;
  }
  else {
    URI_local = (char *)xmlNewTextReader(input_00,URI);
    if ((xmlTextReaderPtr)URI_local == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input_00);
      URI_local = (char *)0x0;
    }
    else {
      ((xmlTextReaderPtr)URI_local)->allocs = ((xmlTextReaderPtr)URI_local)->allocs | 1;
      if (((xmlTextReaderPtr)URI_local)->ctxt->directory == (char *)0x0) {
        local_30 = (xmlChar *)xmlParserGetDirectory(URI);
      }
      if ((((xmlTextReaderPtr)URI_local)->ctxt->directory == (char *)0x0) &&
         (local_30 != (xmlChar *)0x0)) {
        pxVar1 = xmlStrdup(local_30);
        ((xmlTextReaderPtr)URI_local)->ctxt->directory = (char *)pxVar1;
      }
      if (local_30 != (xmlChar *)0x0) {
        (*xmlFree)(local_30);
      }
    }
  }
  return (xmlTextReaderPtr)URI_local;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReaderFilename(const char *URI) {
    xmlParserInputBufferPtr input;
    xmlTextReaderPtr ret;
    char *directory = NULL;

    input = xmlParserInputBufferCreateFilename(URI, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
	return(NULL);
    ret = xmlNewTextReader(input, URI);
    if (ret == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    ret->allocs |= XML_TEXTREADER_INPUT;
    if (ret->ctxt->directory == NULL)
        directory = xmlParserGetDirectory(URI);
    if ((ret->ctxt->directory == NULL) && (directory != NULL))
        ret->ctxt->directory = (char *) xmlStrdup((xmlChar *) directory);
    if (directory != NULL)
	xmlFree(directory);
    return(ret);
}